

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O0

Expression * __thiscall
soul::HEARTGenerator::getAsReference(HEARTGenerator *this,Expression *e,bool isConstRef)

{
  bool bVar1;
  VariableRef *pVVar2;
  VariableDeclaration *pVVar3;
  StructMemberRef *member_00;
  StructMemberRef *pSVar4;
  ArrayElementRef *subscript_00;
  ArrayElementRef *pAVar5;
  Expression *pEVar6;
  Expression *pEVar7;
  CompileMessage local_88;
  pool_ptr<soul::AST::ArrayElementRef> local_50;
  pool_ptr<soul::AST::ArrayElementRef> subscript;
  pool_ptr<soul::AST::StructMemberRef> member;
  pool_ptr<soul::AST::VariableRef> local_30;
  pool_ptr<soul::AST::VariableRef> v;
  bool isConstRef_local;
  Expression *e_local;
  HEARTGenerator *this_local;
  
  v.object._7_1_ = isConstRef;
  cast<soul::AST::VariableRef,soul::AST::Expression>((soul *)&local_30,e);
  bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_30);
  if (bVar1) {
    pVVar2 = pool_ptr<soul::AST::VariableRef>::operator->(&local_30);
    pVVar3 = pool_ref<soul::AST::VariableDeclaration>::operator->(&pVVar2->variable);
    bVar1 = pool_ptr<soul::heart::Variable>::operator!=(&pVVar3->generatedVariable,(void *)0x0);
    if (bVar1) {
      pVVar2 = pool_ptr<soul::AST::VariableRef>::operator->(&local_30);
      pVVar3 = pool_ref<soul::AST::VariableDeclaration>::operator->(&pVVar2->variable);
      this_local = (HEARTGenerator *)AST::VariableDeclaration::getGeneratedVariable(pVVar3);
      bVar1 = true;
      goto LAB_004ab88e;
    }
    if ((v.object._7_1_ & 1) != 0) {
      pVVar2 = pool_ptr<soul::AST::VariableRef>::operator*(&local_30);
      this_local = (HEARTGenerator *)evaluateAsConstantExpression(this,&pVVar2->super_Expression);
      bVar1 = true;
      goto LAB_004ab88e;
    }
  }
  bVar1 = false;
LAB_004ab88e:
  pool_ptr<soul::AST::VariableRef>::~pool_ptr(&local_30);
  if (!bVar1) {
    cast<soul::AST::StructMemberRef,soul::AST::Expression>((soul *)&subscript,e);
    bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&subscript);
    if (bVar1) {
      member_00 = pool_ptr<soul::AST::StructMemberRef>::operator*
                            ((pool_ptr<soul::AST::StructMemberRef> *)&subscript);
      pSVar4 = pool_ptr<soul::AST::StructMemberRef>::operator->
                         ((pool_ptr<soul::AST::StructMemberRef> *)&subscript);
      pEVar6 = pool_ref::operator_cast_to_Expression_((pool_ref *)&pSVar4->object);
      pEVar7 = getAsReference(this,pEVar6,(bool)(v.object._7_1_ & 1));
      this_local = (HEARTGenerator *)createStructSubElement(this,member_00,pEVar7);
    }
    pool_ptr<soul::AST::StructMemberRef>::~pool_ptr
              ((pool_ptr<soul::AST::StructMemberRef> *)&subscript);
    if (!bVar1) {
      cast<soul::AST::ArrayElementRef,soul::AST::Expression>((soul *)&local_50,e);
      bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_50);
      if (bVar1) {
        subscript_00 = pool_ptr<soul::AST::ArrayElementRef>::operator*(&local_50);
        pAVar5 = pool_ptr<soul::AST::ArrayElementRef>::operator->(&local_50);
        pEVar6 = pool_ptr<soul::AST::Expression>::operator*(&pAVar5->object);
        pEVar7 = getAsReference(this,pEVar6,(bool)(v.object._7_1_ & 1));
        this_local = (HEARTGenerator *)createArraySubElement(this,subscript_00,pEVar7);
      }
      pool_ptr<soul::AST::ArrayElementRef>::~pool_ptr(&local_50);
      if (!bVar1) {
        if ((v.object._7_1_ & 1) == 0) {
          Errors::expressionNotAssignable<>();
          AST::Context::throwError(&(e->super_Statement).super_ASTObject.context,&local_88,false);
        }
        this_local = (HEARTGenerator *)getExpressionAsMutableLocalCopy(this,e);
      }
    }
  }
  return (Expression *)this_local;
}

Assistant:

heart::Expression& getAsReference (AST::Expression& e, bool isConstRef)
    {
        if (auto v = cast<AST::VariableRef> (e))
        {
            if (v->variable->generatedVariable != nullptr)
                return v->variable->getGeneratedVariable();

            if (isConstRef)
                return evaluateAsConstantExpression (*v);
        }

        if (auto member = cast<AST::StructMemberRef> (e))
            return createStructSubElement (*member, getAsReference (member->object, isConstRef));

        if (auto subscript = cast<AST::ArrayElementRef> (e))
            return createArraySubElement (*subscript, getAsReference (*subscript->object, isConstRef));

        if (isConstRef)
            return getExpressionAsMutableLocalCopy (e);

        e.context.throwError (Errors::expressionNotAssignable());
    }